

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_inflateZLIBInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  ktx_error_code_e kVar3;
  void *__src;
  ulong uVar4;
  ktx_size_t kVar5;
  long lVar6;
  ktxLevelIndexEntry *__dest;
  long lVar7;
  ktx_uint32_t kVar8;
  float fVar9;
  size_t levelByteLength;
  ulong local_48;
  ktx_uint8_t *local_40;
  ktx_uint8_t *local_38;
  
  if (pInflatedData == (ktx_uint8_t *)0x0 || pDeflatedData == (ktx_uint8_t *)0x0) {
    kVar3 = KTX_INVALID_VALUE;
  }
  else if (This->supercompressionScheme == KTX_SS_END_RANGE) {
    pkVar1 = This->_private;
    uVar4 = (ulong)(This->numLevels * 0x18);
    local_40 = pDeflatedData;
    local_38 = pInflatedData;
    __src = malloc(uVar4);
    if (__src == (void *)0x0) {
      kVar3 = KTX_OUT_OF_MEMORY;
    }
    else {
      __dest = pkVar1->_levelIndex;
      local_48 = uVar4;
      kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
      kVar8 = This->numLevels;
      lVar7 = 0;
      kVar5 = 0;
      while (kVar8 = kVar8 - 1, -1 < (int)kVar8) {
        uVar4 = (ulong)(kVar8 & 0x7fffffff);
        lVar6 = uVar4 * 0x18;
        levelByteLength = inflatedDataCapacity;
        kVar3 = ktxUncompressZLIBInt
                          (local_38 + lVar7,&levelByteLength,local_40 + __dest[uVar4].byteOffset,
                           pkVar1->_levelIndex[uVar4].byteLength);
        if (kVar3 != KTX_SUCCESS) {
LAB_001bdb80:
          free(__src);
          return kVar3;
        }
        uVar4 = This->_private->_levelIndex[uVar4].uncompressedByteLength;
        if (uVar4 != levelByteLength) {
          kVar3 = KTX_DECOMPRESS_LENGTH_ERROR;
          goto LAB_001bdb80;
        }
        *(long *)((long)__src + lVar6) = lVar7;
        *(ulong *)((long)__src + lVar6 + 8) = uVar4;
        *(ulong *)((long)__src + lVar6 + 0x10) = uVar4;
        fVar9 = ceilf((float)uVar4 / (float)kVar2);
        uVar4 = (long)(fVar9 * (float)kVar2) & 0xffffffff;
        kVar5 = kVar5 + uVar4;
        lVar7 = lVar7 + uVar4;
        inflatedDataCapacity = inflatedDataCapacity - uVar4;
      }
      This->dataSize = kVar5;
      This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
      memcpy(__dest,__src,local_48);
      free(__src);
      This->_private->_requiredLevelAlignment = kVar2;
      kVar3 = KTX_SUCCESS;
    }
  }
  else {
    kVar3 = KTX_INVALID_OPERATION;
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZLIBInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint32_t uncompressedLevelAlignment;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZLIB)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength = inflatedDataCapacity;
        KTX_error_code result = ktxUncompressZLIBInt(pInflatedData + levelOffset,
                                                    &levelByteLength,
                                                    &pDeflatedData[cindex[level].byteOffset],
                                                    cindex[level].byteLength);
        if (result != KTX_SUCCESS) {
            free(nindex);
            return result;
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            free(nindex);
            return KTX_DECOMPRESS_LENGTH_ERROR;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(nindex);
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

    return KTX_SUCCESS;
}